

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CURLSession.cpp
# Opt level: O0

bool __thiscall
CURLSession::upload_file
          (CURLSession *this,path *filePath,size_t fileSize,string *rootURL,time_t *uploadTime)

{
  bool bVar1;
  int iVar2;
  value_type *__filename;
  FILE *__p;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  int *piVar4;
  pointer pcVar5;
  pointer pvVar6;
  undefined8 uVar7;
  pointer p_Var8;
  ostream *poVar9;
  char *pcVar10;
  undefined1 local_160 [4];
  CURLcode res;
  unique_ptr<char,_void_(*)(void_*)> local_140;
  path local_130;
  path local_110;
  unique_ptr<char,_void_(*)(void_*)> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> targetURL;
  _func_int__IO_FILE_ptr *local_50;
  undefined1 local_48 [8];
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> filePtr;
  time_t *uploadTime_local;
  string *rootURL_local;
  size_t fileSize_local;
  path *filePath_local;
  CURLSession *this_local;
  
  filePtr._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)uploadTime;
  bVar1 = std::operator!=(&this->m_handle,(nullptr_t)0x0);
  if (!bVar1) {
    __assert_fail("m_handle != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adrian-007[P]camera_streamer/src/CURLSession.cpp"
                  ,0x28,
                  "bool CURLSession::upload_file(const boost::filesystem::path &, size_t, const std::string &, time_t &)"
                 );
  }
  __filename = boost::filesystem::path::c_str(filePath);
  __p = fopen(__filename,"rb");
  local_50 = fclose;
  std::unique_ptr<_IO_FILE,int(*)(_IO_FILE*)>::unique_ptr<int(*)(_IO_FILE*),void>
            ((unique_ptr<_IO_FILE,int(*)(_IO_FILE*)> *)local_48,(pointer)__p,&local_50);
  bVar1 = std::operator==((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48,(nullptr_t)0x0);
  if (bVar1) {
    pbVar3 = boost::filesystem::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,filePath);
    poVar9 = std::operator<<((ostream *)pbVar3,": Cannot open file (");
    piVar4 = __errno_location();
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,*piVar4);
    poVar9 = std::operator<<(poVar9,")");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    targetURL.field_2._8_4_ = 1;
  }
  else {
    std::operator+(&local_e0,rootURL,"/");
    boost::filesystem::path::parent_path();
    boost::filesystem::path::filename();
    boost::filesystem::path::string_abi_cxx11_(&local_110);
    escape_string((CURLSession *)&local_f0,(string *)this);
    pcVar5 = std::unique_ptr<char,_void_(*)(void_*)>::get(&local_f0);
    std::operator+(&local_c0,&local_e0,pcVar5);
    std::operator+(&local_a0,&local_c0,"/");
    boost::filesystem::path::filename();
    boost::filesystem::path::string_abi_cxx11_((path *)local_160);
    escape_string((CURLSession *)&local_140,(string *)this);
    pcVar5 = std::unique_ptr<char,_void_(*)(void_*)>::get(&local_140);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   &local_a0,pcVar5);
    std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_140);
    boost::filesystem::path::~path((path *)local_160);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_f0);
    boost::filesystem::path::~path(&local_110);
    boost::filesystem::path::~path(&local_130);
    std::__cxx11::string::~string((string *)&local_e0);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    curl_easy_setopt(pvVar6,0x2e,1);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    curl_easy_setopt(pvVar6,0x36,1);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    uVar7 = std::__cxx11::string::c_str();
    curl_easy_setopt(pvVar6,0x2712,uVar7);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    p_Var8 = std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get
                       ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
    curl_easy_setopt(pvVar6,0x2719,p_Var8);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    curl_easy_setopt(pvVar6,0x75a3,fileSize);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
    iVar2 = curl_easy_perform(pvVar6);
    this_local._7_1_ = iVar2 == 0;
    if (this_local._7_1_) {
      pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get(&this->m_handle);
      curl_easy_getinfo(pvVar6,0x600032,
                        filePtr._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                        super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                        super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"curl_easy_perform() failed: ");
      pcVar10 = (char *)curl_easy_strerror(iVar2);
      poVar9 = std::operator<<(poVar9,pcVar10);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    targetURL.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)local_80);
  }
  std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr
            ((unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> *)local_48);
  return this_local._7_1_;
}

Assistant:

bool CURLSession::upload_file(const boost::filesystem::path& filePath, size_t fileSize, const std::string& rootURL, time_t& uploadTime)
{
    assert(m_handle != nullptr);

    std::unique_ptr<FILE, int(*)(FILE*)> filePtr { fopen(filePath.c_str(), "rb"), &fclose };

    if (filePtr == nullptr)
    {
        std::cerr << filePath << ": Cannot open file (" << errno << ")" << std::endl;
        return false;
    }

    auto targetURL = rootURL + "/" + escape_string(filePath.parent_path().filename().string()).get() + "/" + escape_string(filePath.filename().string()).get();

    curl_easy_setopt(m_handle.get(), CURLOPT_UPLOAD, 1L);
    curl_easy_setopt(m_handle.get(), CURLOPT_PUT, 1L);
    curl_easy_setopt(m_handle.get(), CURLOPT_URL, targetURL.c_str());
    curl_easy_setopt(m_handle.get(), CURLOPT_READDATA, filePtr.get());
    curl_easy_setopt(m_handle.get(), CURLOPT_INFILESIZE_LARGE, static_cast<curl_off_t>(fileSize));

    auto res = curl_easy_perform(m_handle.get());
    if (res != CURLE_OK)
    {
        std::cerr << "curl_easy_perform() failed: " << curl_easy_strerror(res) << std::endl;
        return false;
    }

    curl_easy_getinfo(m_handle.get(), CURLINFO_TOTAL_TIME_T, &uploadTime);

    return true;
}